

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map> * make_two_big_roaring64_maps(void)

{
  Roaring64Map *this;
  pair<doublechecked::Roaring64Map,_doublechecked::Roaring64Map> *in_RDI;
  result_type choice;
  result_type value;
  size_t i;
  uniform_int_distribution<unsigned_long> rng;
  default_random_engine engine;
  Roaring64Map roaring2;
  Roaring64Map roaring1;
  size_t numValues;
  uint32_t randomSeed;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  Roaring64Map *in_stack_fffffffffffffeb0;
  Roaring64Map *in_stack_fffffffffffffeb8;
  ulong local_118;
  
  doublechecked::Roaring64Map::Roaring64Map(in_stack_fffffffffffffeb0);
  doublechecked::Roaring64Map::Roaring64Map(in_stack_fffffffffffffeb0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             in_stack_fffffffffffffeb0,CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
            );
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)0x1075d7);
  for (local_118 = 0; local_118 < 1000000; local_118 = local_118 + 1) {
    this = (Roaring64Map *)
           std::uniform_int_distribution<unsigned_long>::operator()
                     ((uniform_int_distribution<unsigned_long> *)in_stack_fffffffffffffeb0,
                      (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                      CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    in_stack_fffffffffffffeb8 =
         (Roaring64Map *)
         std::uniform_int_distribution<unsigned_long>::operator()
                   ((uniform_int_distribution<unsigned_long> *)in_stack_fffffffffffffeb0,
                    (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    in_stack_fffffffffffffeb0 = (Roaring64Map *)(ulong)((uint)in_stack_fffffffffffffeb8 & 3);
    switch(in_stack_fffffffffffffeb0) {
    case (Roaring64Map *)0x0:
      doublechecked::Roaring64Map::add(this,(uint64_t)in_stack_fffffffffffffeb8);
      break;
    case (Roaring64Map *)0x1:
      doublechecked::Roaring64Map::add(this,(uint64_t)in_stack_fffffffffffffeb8);
      break;
    case (Roaring64Map *)0x2:
      doublechecked::Roaring64Map::add(this,(uint64_t)in_stack_fffffffffffffeb8);
      doublechecked::Roaring64Map::add(this,(uint64_t)in_stack_fffffffffffffeb8);
      break;
    case (Roaring64Map *)0x3:
      doublechecked::Roaring64Map::add(this,(uint64_t)in_stack_fffffffffffffeb8);
      doublechecked::Roaring64Map::add(this,(uint64_t)in_stack_fffffffffffffeb8);
      break;
    default:
      _assert_true((unsigned_long)this,(char *)in_stack_fffffffffffffeb8,
                   (char *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    }
  }
  std::make_pair<doublechecked::Roaring64Map,doublechecked::Roaring64Map>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  doublechecked::Roaring64Map::~Roaring64Map(in_stack_fffffffffffffeb0);
  doublechecked::Roaring64Map::~Roaring64Map(in_stack_fffffffffffffeb0);
  return in_RDI;
}

Assistant:

std::pair<doublechecked::Roaring64Map, doublechecked::Roaring64Map>
make_two_big_roaring64_maps() {
    // Insert a large number of pseudorandom numbers into two sets.
    const uint32_t randomSeed = 0xdeadbeef;
    const size_t numValues = 1000000;  // 1 million

    doublechecked::Roaring64Map roaring1;
    doublechecked::Roaring64Map roaring2;

    std::default_random_engine engine(randomSeed);
    std::uniform_int_distribution<uint64_t> rng;

    for (size_t i = 0; i < numValues; ++i) {
        auto value = rng(engine);
        auto choice = rng(engine) % 4;
        switch (choice) {
            case 0: {
                // Value is added only to set 1.
                roaring1.add(value);
                break;
            }

            case 1: {
                // Value is added only to set 2.
                roaring2.add(value);
                break;
            }

            case 2: {
                // Value is added to both sets.
                roaring1.add(value);
                roaring2.add(value);
                break;
            }

            case 3: {
                // Value is added to set 1, and a slightly different value
                // is added to set 2. This makes it likely that they are in
                // the same "outer" bin, but at a different "inner" position.
                roaring1.add(value);
                roaring2.add(value + 1);
                break;
            }

            default:
                assert_true(false);
        }
    }
    return std::make_pair(std::move(roaring1), std::move(roaring2));
}